

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerCheckUpperIntBound(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  LabelInstr *target;
  LabelInstr *target_00;
  undefined4 *puVar3;
  Opnd *compareSrc1;
  Opnd *compareSrc2;
  Instr *instr_00;
  OpCode branchOpCode;
  Lowerer *pLVar4;
  Lowerer *pLVar5;
  Lowerer *this_00;
  
  pLVar5 = (Lowerer *)instr->m_prev;
  if (*(OpCode *)&(pLVar5->m_lowererMD).lowererMDArch.helperCallArgsCount == CheckLowerIntBound) {
    pLVar4 = (pLVar5->m_lowererMD).m_lowerer;
    this_00 = pLVar5;
  }
  else {
    this_00 = (Lowerer *)0x0;
    pLVar4 = pLVar5;
  }
  target = IR::LabelInstr::New(Label,instr->m_func,false);
  target_00 = IR::LabelInstr::New(Label,instr->m_func,true);
  if ((instr->m_src1->m_type | TyInt64) != TyUint32) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x71e8,"(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32())",
                       "instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32()");
    if (!bVar2) goto LAB_005c821d;
    *puVar3 = 0;
  }
  compareSrc1 = IR::Instr::UnlinkSrc1(instr);
  pLVar5 = (Lowerer *)instr;
  compareSrc2 = IR::Instr::UnlinkSrc2(instr);
  if (this_00 == (Lowerer *)0x0) {
    branchOpCode = BrLe_A;
  }
  else {
    InsertCompareBranch(pLVar5,compareSrc1,compareSrc2,BrGt_A,false,target_00,instr,false);
    if (((this_00->m_lowererMD).lowererMDArch.helperCallArgs[2]->m_type | TyInt64) != TyUint32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x71ed,
                         "(lowerBoundCheckInstr->GetSrc1()->IsInt32() || lowerBoundCheckInstr->GetSrc1()->IsUInt32())"
                         ,
                         "lowerBoundCheckInstr->GetSrc1()->IsInt32() || lowerBoundCheckInstr->GetSrc1()->IsUInt32()"
                        );
      if (!bVar2) {
LAB_005c821d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    compareSrc1 = IR::Instr::UnlinkSrc1((Instr *)this_00);
    pLVar5 = this_00;
    compareSrc2 = IR::Instr::UnlinkSrc2((Instr *)this_00);
    branchOpCode = BrGe_A;
  }
  InsertCompareBranch(pLVar5,compareSrc1,compareSrc2,branchOpCode,false,target,instr,false);
  IR::Instr::InsertBefore(instr,&target_00->super_Instr);
  instr_00 = IR::Instr::New(CALL,instr->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  LowererMD::ChangeToHelperCall
            (&this->m_lowererMD,instr_00,HelperIntRangeCheckFailure,(LabelInstr *)0x0,(Opnd *)0x0,
             (PropertySymOpnd *)0x0,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  IR::Instr::Remove(instr);
  if (this_00 != (Lowerer *)0x0) {
    IR::Instr::Remove((Instr *)this_00);
  }
  return (Instr *)pLVar4;
}

Assistant:

IR::Instr*
Lowerer::LowerCheckUpperIntBound(IR::Instr * instr)
{
    bool lowerBoundCheckPresent = instr->m_prev->m_opcode == Js::OpCode::CheckLowerIntBound;
    IR::Instr * instrPrev = lowerBoundCheckPresent ? instr->m_prev->m_prev : instr->m_prev;

    IR::Instr * lowerBoundCheckInstr = lowerBoundCheckPresent ? instr->m_prev : nullptr;

    IR::LabelInstr * continueLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, false /*isOpHelper*/);
    IR::LabelInstr * helperLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func, true /*isOpHelper*/);

    Assert(instr->GetSrc1()->IsInt32() || instr->GetSrc1()->IsUInt32());
    if (lowerBoundCheckInstr)
    {
        InsertCompareBranch(instr->UnlinkSrc1(), instr->UnlinkSrc2(), Js::OpCode::BrGt_A, helperLabel, instr);

        Assert(lowerBoundCheckInstr->GetSrc1()->IsInt32() || lowerBoundCheckInstr->GetSrc1()->IsUInt32());
        InsertCompareBranch(lowerBoundCheckInstr->UnlinkSrc1(), lowerBoundCheckInstr->UnlinkSrc2(), Js::OpCode::BrGe_A, continueLabel, instr);
    }
    else
    {
        InsertCompareBranch(instr->UnlinkSrc1(), instr->UnlinkSrc2(), Js::OpCode::BrLe_A, continueLabel, instr);
    }

    instr->InsertBefore(helperLabel);
    IR::Instr* helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    instr->InsertBefore(helperCallInstr);
    m_lowererMD.ChangeToHelperCall(helperCallInstr, IR::HelperIntRangeCheckFailure);

    instr->InsertAfter(continueLabel);

    instr->Remove();
    if (lowerBoundCheckInstr)
    {
        lowerBoundCheckInstr->Remove();
    }

    return instrPrev;
}